

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

void llhttp_reset(llhttp_t *parser)

{
  undefined1 uVar1;
  undefined2 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RDI;
  uint16_t lenient_flags;
  void *data;
  llhttp_settings_t *settings;
  llhttp_type_t type;
  
  uVar1 = *(undefined1 *)(in_RDI + 0x48);
  uVar3 = *(undefined8 *)(in_RDI + 0x58);
  uVar4 = *(undefined8 *)(in_RDI + 0x30);
  uVar2 = *(undefined2 *)(in_RDI + 0x4e);
  llhttp__internal_init((llhttp__internal_t *)0x103bba);
  *(undefined1 *)(in_RDI + 0x48) = uVar1;
  *(undefined8 *)(in_RDI + 0x58) = uVar3;
  *(undefined8 *)(in_RDI + 0x30) = uVar4;
  *(undefined2 *)(in_RDI + 0x4e) = uVar2;
  return;
}

Assistant:

void llhttp_reset(llhttp_t* parser) {
  llhttp_type_t type = parser->type;
  const llhttp_settings_t* settings = parser->settings;
  void* data = parser->data;
  uint16_t lenient_flags = parser->lenient_flags;

  llhttp__internal_init(parser);

  parser->type = type;
  parser->settings = (void*) settings;
  parser->data = data;
  parser->lenient_flags = lenient_flags;
}